

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall HdlcAnalyzer::ProcessAddressField(HdlcAnalyzer *this,HdlcByte byteAfterFlag)

{
  bool bVar1;
  long lVar2;
  Frame frame;
  U64 local_88;
  U64 UStack_80;
  ulong local_78;
  long local_70;
  undefined1 local_68;
  byte local_67;
  vector<Frame,_std::allocator<Frame>_> *local_60;
  U64 local_58;
  U64 UStack_50;
  HdlcByte local_48;
  
  if (this->mAbortFrame == false) {
    if (((this->mSettings)._M_ptr)->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD) {
      Frame::Frame((Frame *)&local_88);
      local_88 = byteAfterFlag.startSample;
      UStack_80 = byteAfterFlag.endSample;
      local_68 = 1;
      local_70 = 0;
      local_67 = byteAfterFlag.escaped;
      local_78 = (ulong)byteAfterFlag.value;
      std::vector<Frame,_std::allocator<Frame>_>::push_back
                (&this->mResultFrames,(value_type *)&local_88);
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)local_88,(Channel *)0x8);
LAB_00108434:
      Frame::~Frame((Frame *)&local_88);
    }
    else {
      local_58 = byteAfterFlag.startSample;
      UStack_50 = byteAfterFlag.endSample;
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)byteAfterFlag.startSample,
                 (Channel *)0x8);
      local_60 = &this->mResultFrames;
      lVar2 = 0;
      do {
        Frame::Frame((Frame *)&local_88);
        local_88 = local_58;
        UStack_80 = UStack_50;
        local_68 = 2;
        local_78 = (ulong)byteAfterFlag.value;
        local_70 = lVar2;
        local_67 = byteAfterFlag.escaped & 1;
        std::vector<Frame,_std::allocator<Frame>_>::push_back(local_60,(value_type *)&local_88);
        if ((byteAfterFlag.value & 1) == 0) goto LAB_00108434;
        ReadByte(&local_48,this);
        byteAfterFlag.escaped = local_48.escaped;
        byteAfterFlag.value = local_48.value;
        local_58 = local_48.startSample;
        UStack_50 = local_48.endSample;
        bVar1 = this->mAbortFrame;
        Frame::~Frame((Frame *)&local_88);
        lVar2 = lVar2 + 1;
      } while (bVar1 == false);
    }
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessAddressField( HdlcByte byteAfterFlag )
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
    {
        U8 flag = ( byteAfterFlag.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame =
            CreateFrame( HDLC_FIELD_BASIC_ADDRESS, byteAfterFlag.startSample, byteAfterFlag.endSample, byteAfterFlag.value, 0, flag );
        AddFrameToResults( frame );

        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( frame.mStartingSampleInclusive, AnalyzerResults::Start, mSettings->mInputChannel );
    }
    else // HDLC_EXTENDED_ADDRESS_FIELD
    {
        int i = 0;
        HdlcByte addressByte = byteAfterFlag;
        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( addressByte.startSample, AnalyzerResults::Start, mSettings->mInputChannel );
        for( ;; )
        {
            U8 flag = ( addressByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
            Frame frame =
                CreateFrame( HDLC_FIELD_EXTENDED_ADDRESS, addressByte.startSample, addressByte.endSample, addressByte.value, i++, flag );
            AddFrameToResults( frame );

            U8 lsbBit = addressByte.value & 0x01;
            if( !lsbBit ) // End of Extended Address Field?
            {
                return;
            }

            // Next address byte
            addressByte = ReadByte();
            if( mAbortFrame )
            {
                return;
            }
        }
    }
}